

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

size_t FNV2(char *key,int len,size_t seed)

{
  size_t sVar1;
  size_t h;
  ulong *puVar2;
  ulong uVar3;
  size_t *dw;
  
  uVar3 = (ulong)len;
  sVar1 = seed ^ 0xcbf29ce484222325;
  for (puVar2 = (ulong *)key; puVar2 < key + (uVar3 & 0xfffffffffffffff8); puVar2 = puVar2 + 1) {
    sVar1 = (sVar1 ^ *puVar2) * 0x100000001b3;
  }
  if ((uVar3 & 7) != 0) {
    for (; puVar2 < key + uVar3; puVar2 = (ulong *)((long)puVar2 + 1)) {
      sVar1 = (sVar1 ^ (byte)*puVar2) * 0x100000001b3;
    }
  }
  return sVar1;
}

Assistant:

size_t
FNV2(const char *key, int len, size_t seed)
{
  size_t h = seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
#ifdef HAVE_BIT32
  h ^= UINT32_C(2166136261);
#else
  h ^= UINT64_C(0xcbf29ce484222325);
#endif
  while (dw < endw) {
    h ^= *dw++;
#ifdef HAVE_BIT32
    h *= UINT32_C(16777619);
#else
    h *= UINT64_C(0x100000001b3);
#endif
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h ^= *dc++;
#ifdef HAVE_BIT32
      h *= UINT32_C(16777619);
#else
      h *= UINT64_C(0x100000001b3);
#endif
    }
  }
  return h;
}